

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_algorithms_tests.hpp
# Opt level: O0

void test_parallel_for(void)

{
  anon_class_1_0_00000001_for_func local_45 [20];
  allocator<char> local_31;
  string local_30;
  test local_9 [8];
  test __t;
  
  test::test(local_9,"test_parallel_for");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"FibonacciParallelFor",&local_31);
  oqpi::
  helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
  ::parallel_for<test_parallel_for()::__0>(&local_30,gTaskCount,local_45);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  test::~test(local_9);
  return;
}

Assistant:

void test_parallel_for()
{
    TEST_FUNC;

    oqpi_tk::parallel_for("FibonacciParallelFor", gTaskCount, [](int32_t i)
    {
        volatile auto a = 0ull;
        a += fibonacci(gValue + a);
        a += i;
    });
}